

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  ostream *poVar4;
  allocator<char> local_18a;
  allocator<char> local_189;
  undefined1 local_188 [64];
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> columns;
  undefined1 local_120 [64];
  SummaryColumn local_e0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  sVar1 = (totals->testCases).failed;
  sVar2 = (totals->testCases).failedButOk;
  if ((totals->testCases).passed + sVar1 + sVar2 == 0) {
    poVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_188._0_8_ = (ulong)(uint7)local_188._1_7_ << 8;
    Colour::use(BrightYellow);
    std::operator<<(poVar4,"No tests ran\n");
    Colour::~Colour((Colour *)local_188);
  }
  else if ((sVar2 == 0 && sVar1 == 0) &&
          ((totals->assertions).failed + (totals->assertions).passed !=
           -(totals->assertions).failedButOk)) {
    poVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    local_188._0_8_ = (ulong)(uint7)local_188._1_7_ << 8;
    Colour::use(BrightGreen);
    std::operator<<(poVar4,"All tests passed");
    Colour::~Colour((Colour *)local_188);
    poVar4 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream," ("
                            );
    pcVar3 = (pointer)(totals->assertions).passed;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"assertion",&local_18a);
    local_188._0_8_ = pcVar3;
    std::__cxx11::string::string((string *)(local_188 + 8),(string *)&local_e0);
    Catch::operator<<(poVar4,(pluralise *)local_188);
    poVar4 = std::operator<<(poVar4," in ");
    pcVar3 = (pointer)(totals->testCases).passed;
    std::__cxx11::string::string<std::allocator<char>>((string *)&columns,"test case",&local_189);
    local_120._0_8_ = pcVar3;
    std::__cxx11::string::string((string *)(local_120 + 8),(string *)&columns);
    Catch::operator<<(poVar4,(pluralise *)local_120);
    poVar4 = std::operator<<(poVar4,')');
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&columns);
    std::__cxx11::string::~string((string *)(local_188 + 8));
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    columns.super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    columns.super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    columns.super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_18a);
    SummaryColumn::SummaryColumn(&local_e0,&local_40,None);
    SummaryColumn::addRow
              ((SummaryColumn *)local_120,&local_e0,
               (totals->testCases).failed + (totals->testCases).passed +
               (totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_188,(SummaryColumn *)local_120,
               (totals->assertions).failed + (totals->assertions).passed +
               (totals->assertions).failedButOk);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>(&columns,(SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_120);
    SummaryColumn::~SummaryColumn(&local_e0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"passed",&local_18a);
    SummaryColumn::SummaryColumn(&local_e0,&local_60,Green);
    SummaryColumn::addRow((SummaryColumn *)local_120,&local_e0,(totals->testCases).passed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_188,(SummaryColumn *)local_120,(totals->assertions).passed);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>(&columns,(SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_120);
    SummaryColumn::~SummaryColumn(&local_e0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"failed",&local_18a);
    SummaryColumn::SummaryColumn(&local_e0,&local_80,BrightRed);
    SummaryColumn::addRow((SummaryColumn *)local_120,&local_e0,(totals->testCases).failed);
    SummaryColumn::addRow
              ((SummaryColumn *)local_188,(SummaryColumn *)local_120,(totals->assertions).failed);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>(&columns,(SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_120);
    SummaryColumn::~SummaryColumn(&local_e0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"failed as expected",&local_18a);
    SummaryColumn::SummaryColumn(&local_e0,&local_a0,BrightYellow);
    SummaryColumn::addRow((SummaryColumn *)local_120,&local_e0,(totals->testCases).failedButOk);
    SummaryColumn::addRow
              ((SummaryColumn *)local_188,(SummaryColumn *)local_120,
               (totals->assertions).failedButOk);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::
    emplace_back<Catch::SummaryColumn>(&columns,(SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_188);
    SummaryColumn::~SummaryColumn((SummaryColumn *)local_120);
    SummaryColumn::~SummaryColumn(&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,"test cases",(allocator<char> *)local_120);
    printSummaryRow(this,(string *)local_188,&columns,0);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,"assertions",(allocator<char> *)local_120);
    printSummaryRow(this,(string *)local_188,&columns,1);
    std::__cxx11::string::~string((string *)local_188);
    clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::~vector
              (&columns);
  }
  return;
}

Assistant:

void ConsoleReporter::printTotals( Totals const& totals ) {
    if (totals.testCases.total() == 0) {
        stream << Colour(Colour::Warning) << "No tests ran\n";
    } else if (totals.assertions.total() > 0 && totals.testCases.allPassed()) {
        stream << Colour(Colour::ResultSuccess) << "All tests passed";
        stream << " ("
            << pluralise(totals.assertions.passed, "assertion") << " in "
            << pluralise(totals.testCases.passed, "test case") << ')'
            << '\n';
    } else {

        std::vector<SummaryColumn> columns;
        columns.push_back(SummaryColumn("", Colour::None)
                          .addRow(totals.testCases.total())
                          .addRow(totals.assertions.total()));
        columns.push_back(SummaryColumn("passed", Colour::Success)
                          .addRow(totals.testCases.passed)
                          .addRow(totals.assertions.passed));
        columns.push_back(SummaryColumn("failed", Colour::ResultError)
                          .addRow(totals.testCases.failed)
                          .addRow(totals.assertions.failed));
        columns.push_back(SummaryColumn("failed as expected", Colour::ResultExpectedFailure)
                          .addRow(totals.testCases.failedButOk)
                          .addRow(totals.assertions.failedButOk));

        printSummaryRow("test cases", columns, 0);
        printSummaryRow("assertions", columns, 1);
    }
}